

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O1

void __thiscall ObjLoader::parseFile(ObjLoader *this,string *filename)

{
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *this_00;
  pointer *ppvVar1;
  pointer *ppvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  int iVar3;
  iterator iVar4;
  iterator __position;
  iterator __position_00;
  pointer pvVar5;
  pointer paVar6;
  pointer pfVar7;
  pointer pfVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  ostream *poVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  string *psVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  SimpleMaterial material;
  string err;
  attrib_t attrib;
  material_t defaultMaterial;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_7f8;
  ObjLoader *local_7d8;
  float local_7cc;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> local_7c8;
  undefined1 local_7b0 [8];
  float fStack_7a8;
  undefined4 uStack_7a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_790;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_784;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::qualifier)0>_3 local_778;
  float local_76c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
  *local_708;
  long local_700;
  pointer local_6f8;
  long local_6f0;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  undefined1 local_668 [16];
  ulong local_650;
  ulong local_648;
  vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
  *local_640;
  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
  *local_638;
  pointer local_630;
  pointer local_628;
  pointer local_620;
  attrib_t local_618;
  undefined1 local_5b8 [16];
  value_type local_5a0;
  
  local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7f8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7f8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7f8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  local_688._M_string_length = 0;
  local_688.field_2._M_local_buf[0] = '\0';
  bVar9 = tinyobj::LoadObj(&local_618,&local_7c8,&local_7f8,&local_688,(filename->_M_dataplus)._M_p,
                           (this->m_rootDir)._M_dataplus._M_p,true);
  if (local_688._M_string_length != 0) {
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_688._M_dataplus._M_p,local_688._M_string_length
                        );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if (bVar9) {
    local_5a0.name._M_dataplus._M_p = (pointer)&local_5a0.name.field_2;
    local_5a0.name._M_string_length = 0;
    local_5a0.name.field_2._M_local_buf[0] = '\0';
    local_5a0.ambient_texname._M_dataplus._M_p = (pointer)&local_5a0.ambient_texname.field_2;
    local_5a0.ambient_texname._M_string_length = 0;
    local_5a0.ambient_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.diffuse_texname._M_dataplus._M_p = (pointer)&local_5a0.diffuse_texname.field_2;
    local_5a0.diffuse_texname._M_string_length = 0;
    local_5a0.diffuse_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.specular_texname._M_dataplus._M_p = (pointer)&local_5a0.specular_texname.field_2;
    local_5a0.specular_texname._M_string_length = 0;
    local_5a0.specular_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.specular_highlight_texname._M_dataplus._M_p =
         (pointer)&local_5a0.specular_highlight_texname.field_2;
    local_5a0.specular_highlight_texname._M_string_length = 0;
    local_5a0.specular_highlight_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.bump_texname._M_dataplus._M_p = (pointer)&local_5a0.bump_texname.field_2;
    local_5a0.bump_texname._M_string_length = 0;
    local_5a0.bump_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.displacement_texname._M_dataplus._M_p =
         (pointer)&local_5a0.displacement_texname.field_2;
    local_5a0.displacement_texname._M_string_length = 0;
    local_5a0.displacement_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.alpha_texname._M_dataplus._M_p = (pointer)&local_5a0.alpha_texname.field_2;
    local_5a0.alpha_texname._M_string_length = 0;
    local_5a0.alpha_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.reflection_texname._M_dataplus._M_p = (pointer)&local_5a0.reflection_texname.field_2;
    local_5a0.reflection_texname._M_string_length = 0;
    local_5a0.reflection_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.roughness_texname._M_dataplus._M_p = (pointer)&local_5a0.roughness_texname.field_2;
    local_5a0.roughness_texname._M_string_length = 0;
    local_5a0.roughness_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.metallic_texname._M_dataplus._M_p = (pointer)&local_5a0.metallic_texname.field_2;
    local_5a0.metallic_texname._M_string_length = 0;
    local_5a0.metallic_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.sheen_texname._M_dataplus._M_p = (pointer)&local_5a0.sheen_texname.field_2;
    local_5a0.sheen_texname._M_string_length = 0;
    local_5a0.sheen_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.emissive_texname._M_dataplus._M_p = (pointer)&local_5a0.emissive_texname.field_2;
    local_5a0.emissive_texname._M_string_length = 0;
    local_5a0.emissive_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.normal_texname._M_dataplus._M_p = (pointer)&local_5a0.normal_texname.field_2;
    local_5a0.normal_texname._M_string_length = 0;
    local_5a0.normal_texname.field_2._M_local_buf[0] = '\0';
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_5a0.ambient[2] = 0.1;
    local_5a0.diffuse[0] = 0.3;
    local_5a0.ambient[0] = 0.1;
    local_5a0.ambient[1] = 0.1;
    local_5a0.diffuse[1] = 0.3;
    local_5a0.diffuse[2] = 0.3;
    local_5a0.specular[2] = 0.2;
    local_5a0.specular[0] = 0.2;
    local_5a0.specular[1] = 0.2;
    local_5a0.shininess = 1.0;
    local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_5a0.unknown_parameter._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_5a0.name,0,0,"default_material",0x10);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
              (&local_7f8,&local_5a0);
    if (local_7f8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_7f8.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      lVar15 = 0;
      uVar18 = 0;
      do {
        paVar6 = local_7f8.
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_7b0 = (undefined1  [8])&local_7a0;
        _fStack_7a8 = 0;
        local_7a0._M_local_buf[0] = '\0';
        local_768._M_string_length = 0;
        local_768.field_2._M_local_buf[0] = '\0';
        local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
        local_748._M_string_length = 0;
        local_748.field_2._M_local_buf[0] = '\0';
        local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
        local_728._M_string_length = 0;
        local_728.field_2._M_local_buf[0] = '\0';
        local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)(local_7f8.
                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar15 + -0x20));
        psVar17 = (string *)((long)paVar6->emission + lVar15 + 0x40);
        local_790.field_0.z = *(float *)((long)paVar6->ambient + lVar15 + 8);
        local_790._0_8_ = *(undefined8 *)((long)paVar6->ambient + lVar15);
        local_784.field_0.z = *(float *)((long)paVar6->diffuse + lVar15 + 8);
        local_784._0_8_ = *(undefined8 *)((long)paVar6->diffuse + lVar15);
        local_778.field_0.z = *(float *)((long)paVar6->specular + lVar15 + 8);
        local_778._0_8_ = *(undefined8 *)((long)paVar6->specular + lVar15);
        local_76c = *(float *)((long)paVar6->emission + lVar15 + 0xc);
        iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(psVar17,"");
        if (iVar10 == 0) {
          psVar17 = &defaultDiffuseName_abi_cxx11_;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_768,psVar17);
        this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)(paVar6->roughness_texopt).origin_offset + lVar15 + -0x30);
        iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(this_02,"");
        psVar17 = this_02;
        if (iVar10 == 0) {
          psVar17 = &defaultNormalName_abi_cxx11_;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_748,psVar17);
        iVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 compare(this_02,"");
        psVar17 = (string *)((long)paVar6->emission + lVar15 + 0x60);
        if (iVar10 == 0) {
          psVar17 = &defaultDiffuseName_abi_cxx11_;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_728,psVar17);
        local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
        lVar16 = *(long *)((long)paVar6->emission + lVar15 + 0x40);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6a8,lVar16,
                   *(long *)((long)paVar6->emission + lVar15 + 0x48) + lVar16);
        loadImage(this,&local_6a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
          operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
        }
        local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
        lVar16 = *(long *)((long)(paVar6->roughness_texopt).origin_offset + lVar15 + -0x30);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6c8,lVar16,
                   *(long *)((long)(paVar6->roughness_texopt).origin_offset + lVar15 + -0x28) +
                   lVar16);
        loadImage(this,&local_6c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
          operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
        }
        local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
        lVar16 = *(long *)((long)paVar6->emission + lVar15 + 0x60);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6e8,lVar16,
                   *(long *)((long)paVar6->emission + lVar15 + 0x68) + lVar16);
        loadImage(this,&local_6e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e8._M_dataplus._M_p != &local_6e8.field_2) {
          operator_delete(local_6e8._M_dataplus._M_p,local_6e8.field_2._M_allocated_capacity + 1);
        }
        std::vector<SimpleMaterial,_std::allocator<SimpleMaterial>_>::push_back
                  (&this->m_materials,(value_type *)local_7b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_728._M_dataplus._M_p != &local_728.field_2) {
          operator_delete(local_728._M_dataplus._M_p,
                          CONCAT71(local_728.field_2._M_allocated_capacity._1_7_,
                                   local_728.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._M_dataplus._M_p != &local_748.field_2) {
          operator_delete(local_748._M_dataplus._M_p,
                          CONCAT71(local_748.field_2._M_allocated_capacity._1_7_,
                                   local_748.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_768._M_dataplus._M_p != &local_768.field_2) {
          operator_delete(local_768._M_dataplus._M_p,
                          CONCAT71(local_768.field_2._M_allocated_capacity._1_7_,
                                   local_768.field_2._M_local_buf[0]) + 1);
        }
        if (local_7b0 != (undefined1  [8])&local_7a0) {
          operator_delete((void *)local_7b0,
                          CONCAT71(local_7a0._M_allocated_capacity._1_7_,local_7a0._M_local_buf[0])
                          + 1);
        }
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x570;
      } while (uVar18 < (ulong)(((long)local_7f8.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_7f8.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               0x66fd0eb66fd0eb67));
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&this->m_ibos,
             ((long)(this->m_materials).
                    super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_materials).
                    super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
    pfVar8 = local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar7 = local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_620 = local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_638 = (vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                   *)&this->m_vertexPositions;
      local_6f8 = local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      this_00 = &this->m_vertexNormals;
      local_628 = local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_708 = (vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                   *)&this->m_vertexUVs;
      local_630 = local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_640 = (vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
                   *)&this->m_vertexColors;
      uVar18 = 0;
      local_7d8 = this;
      do {
        lVar15 = uVar18 * 0x80;
        local_650 = uVar18;
        if (local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18].mesh.num_face_vertices.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_7c8.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18].mesh.num_face_vertices.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_6f0 = 0;
          uVar18 = 0;
          local_700 = lVar15;
          do {
            iVar10 = *(int *)(*(long *)((long)&((local_7c8.
                                                 super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->mesh).
                                               material_ids.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar15) +
                             uVar18 * 4);
            if ((iVar10 < 0) ||
               (iVar13 = (int)((ulong)((long)local_7f8.
                                             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_7f8.
                                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 4),
               SBORROW4(iVar10,iVar13 * 0x6fd0eb67) == iVar10 + iVar13 * -0x6fd0eb67 < 0)) {
              iVar10 = (int)((ulong)((long)local_7f8.
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_7f8.
                                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       0x6fd0eb67 + -1;
            }
            local_668._0_8_ = (long)iVar10;
            lVar16 = 8;
            local_648 = uVar18;
            do {
              lVar15 = *(long *)((long)&((local_7c8.
                                          super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                                        super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar15) +
                       local_6f0;
              iVar10 = *(int *)(lVar16 + -8 + lVar15);
              iVar13 = *(int *)(lVar16 + -4 + lVar15);
              iVar3 = *(int *)(lVar16 + lVar15);
              lVar15 = (long)(iVar10 * 3);
              fVar23 = local_620[lVar15 + 2];
              local_7b0._4_4_ = local_620[lVar15 + 1];
              local_7b0._0_4_ = local_620[(long)iVar10 * 3];
              iVar4._M_current =
                   (this->m_vertexPositions).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              fStack_7a8 = fVar23;
              if (iVar4._M_current ==
                  (this->m_vertexPositions).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                          (local_638,iVar4,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                ((iVar4._M_current)->field_0).field_0.z = fVar23;
                *(undefined1 (*) [8])&(iVar4._M_current)->field_0 = local_7b0;
                ppvVar1 = &(this->m_vertexPositions).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
              if (local_6f8 != pfVar7) {
                lVar14 = (long)(iVar13 * 3);
                fStack_7a8 = -pfVar7[lVar14 + 2];
                local_7b0 = (undefined1  [8])
                            (CONCAT44(pfVar7[lVar14 + 1],pfVar7[(long)iVar13 * 3]) ^
                            0x8000000080000000);
                iVar4._M_current =
                     (local_7d8->m_vertexNormals).
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (local_7d8->m_vertexNormals).
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>>
                            ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                              *)this_00,iVar4,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
                }
                else {
                  ((iVar4._M_current)->field_0).field_0.z = fStack_7a8;
                  *(undefined1 (*) [8])&(iVar4._M_current)->field_0 = local_7b0;
                  ppvVar1 = &(local_7d8->m_vertexNormals).
                             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppvVar1 = *ppvVar1 + 1;
                }
              }
              if (local_628 == pfVar8) {
                local_7b0 = (undefined1  [8])0x0;
                std::
                vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                          (local_708,(vec<2,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                local_7b0._4_4_ = pfVar8[iVar3 * 2 + 1];
                local_7b0._0_4_ = pfVar8[(long)iVar3 * 2];
                std::
                vector<glm::vec<2,float,(glm::qualifier)0>,std::allocator<glm::vec<2,float,(glm::qualifier)0>>>
                ::emplace_back<glm::vec<2,float,(glm::qualifier)0>>
                          (local_708,(vec<2,_float,_(glm::qualifier)0> *)local_7b0);
              }
              this = local_7d8;
              local_7b0._4_4_ = local_630[lVar15 + 1];
              local_7b0._0_4_ = local_630[(long)iVar10 * 3];
              uStack_7a4 = 0x3f800000;
              fStack_7a8 = local_630[lVar15 + 2];
              __position._M_current =
                   (local_7d8->m_vertexColors).
                   super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (local_7d8->m_vertexColors).
                  super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<4,float,(glm::qualifier)0>,std::allocator<glm::vec<4,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<4,float,(glm::qualifier)0>>
                          (local_640,__position,(vec<4,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                *(undefined1 (*) [8])&(__position._M_current)->field_0 = local_7b0;
                *(undefined8 *)((long)&(__position._M_current)->field_0 + 8) = _fStack_7a8;
                ppvVar2 = &(local_7d8->m_vertexColors).
                           super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar2 = *ppvVar2 + 1;
              }
              lVar15 = local_700;
              this_01 = (this->m_ibos).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_668._0_8_;
              uVar11 = (int)((ulong)((long)(this->m_vertexPositions).
                                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_vertexPositions).
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                       -0x55555555 - 1;
              local_7b0._0_4_ = uVar11;
              __position_00._M_current =
                   (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(this_01,__position_00,(uint *)local_7b0);
              }
              else {
                *__position_00._M_current = uVar11;
                (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position_00._M_current + 1;
              }
              uVar18 = local_648;
              lVar16 = lVar16 + 0xc;
            } while (lVar16 != 0x2c);
            if (local_6f8 == pfVar7) {
              pvVar5 = (this->m_vertexPositions).
                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              fVar23 = pvVar5[-3].field_0.field_0.x;
              fVar25 = pvVar5[-3].field_0.field_0.y;
              fVar19 = pvVar5[-2].field_0.field_0.x - fVar23;
              fVar21 = pvVar5[-2].field_0.field_0.y - fVar25;
              fVar20 = pvVar5[-3].field_0.field_0.z;
              fVar24 = pvVar5[-2].field_0.field_0.z - fVar20;
              fVar23 = pvVar5[-1].field_0.field_0.x - fVar23;
              fVar25 = pvVar5[-1].field_0.field_0.y - fVar25;
              fVar20 = pvVar5[-1].field_0.field_0.z - fVar20;
              fVar22 = fVar21 * fVar20 - fVar24 * fVar25;
              fVar20 = fVar24 * fVar23 - fVar20 * fVar19;
              fVar23 = fVar25 * fVar19 - fVar23 * fVar21;
              fVar25 = fVar23 * fVar23 + fVar20 * fVar20 + fVar22 * fVar22;
              if (fVar25 < 0.0) {
                local_668 = ZEXT416((uint)fVar20);
                local_5b8 = ZEXT416((uint)fVar22);
                local_7cc = fVar23;
                fVar25 = sqrtf(fVar25);
                fVar22 = (float)local_5b8._0_4_;
                fVar20 = (float)local_668._0_4_;
                fVar23 = local_7cc;
              }
              else {
                fVar25 = SQRT(fVar25);
              }
              fVar25 = 1.0 / fVar25;
              local_7b0 = (undefined1  [8])CONCAT44(fVar20 * fVar25,fVar22 * fVar25);
              fStack_7a8 = fVar23 * fVar25;
              iVar4._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->m_vertexNormals).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                          ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                            *)this_00,iVar4,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                ((iVar4._M_current)->field_0).field_0.z = fVar23 * fVar25;
                *(undefined1 (*) [8])&(iVar4._M_current)->field_0 = local_7b0;
                ppvVar1 = &(this->m_vertexNormals).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
              iVar4._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->m_vertexNormals).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                          ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                            *)this_00,iVar4,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                ((iVar4._M_current)->field_0).field_0.z = fStack_7a8;
                *(undefined1 (*) [8])&(iVar4._M_current)->field_0 = local_7b0;
                ppvVar1 = &(this->m_vertexNormals).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
              iVar4._M_current =
                   (this->m_vertexNormals).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->m_vertexNormals).
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                          ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                            *)this_00,iVar4,(vec<3,_float,_(glm::qualifier)0> *)local_7b0);
              }
              else {
                ((iVar4._M_current)->field_0).field_0.z = fStack_7a8;
                *(undefined1 (*) [8])&(iVar4._M_current)->field_0 = local_7b0;
                ppvVar1 = &(this->m_vertexNormals).
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppvVar1 = *ppvVar1 + 1;
              }
            }
            uVar18 = uVar18 + 1;
            local_6f0 = local_6f0 + 0x24;
          } while (uVar18 < (ulong)(*(long *)((long)&((local_7c8.
                                                                                                              
                                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->mesh).
                                                  num_face_vertices.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                             lVar15) -
                                   *(long *)((long)&((local_7c8.
                                                                                                            
                                                  super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->mesh).
                                                  num_face_vertices.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar15
                                            )));
        }
        uVar18 = local_650 + 1;
      } while (uVar18 < (ulong)((long)local_7c8.
                                      super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_7c8.
                                      super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 7));
    }
    computeTangents(this);
    cleanUpDuplicates(this);
    tinyobj::anon_struct_1392_47_816f60ef::~material_t(&local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      operator_delete(local_688._M_dataplus._M_p,
                      CONCAT71(local_688.field_2._M_allocated_capacity._1_7_,
                               local_688.field_2._M_local_buf[0]) + 1);
    }
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&local_7f8);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&local_7c8);
    if (local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_618.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_618.colors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_618.colors.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_618.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_618.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_618.normals.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_618.normals.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_618.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_618.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_618.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  exit(1);
}

Assistant:

void ObjLoader::parseFile(const std::string & filename)
{
  tinyobj::attrib_t attrib;
  std::vector<tinyobj::shape_t> shapes;
  std::vector<tinyobj::material_t> materials;
  std::string err;
  bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &err, filename.c_str(), m_rootDir.c_str());
  if (!err.empty()) {
    std::cerr << err << std::endl;
  }
  if (!ret) {
    exit(1);
  }

  // Loop over materials
  tinyobj::material_t defaultMaterial;
  defaultMaterial.ambient[0] = defaultMaterial.ambient[1] = defaultMaterial.ambient[2] = 0.1;
  defaultMaterial.diffuse[0] = defaultMaterial.diffuse[1] = defaultMaterial.diffuse[2] = 0.3;
  defaultMaterial.specular[0] = defaultMaterial.specular[1] = defaultMaterial.specular[2] = 0.2;
  defaultMaterial.shininess = 1;
  defaultMaterial.name = "default_material";
  materials.push_back(defaultMaterial);
  for (size_t m = 0; m < materials.size(); m++) {
    tinyobj::material_t * mp = &materials[m];
    SimpleMaterial material;
    material.name = mp->name;
    material.ambient = *reinterpret_cast<glm::vec3 *>(mp->ambient);
    material.diffuse = *reinterpret_cast<glm::vec3 *>(mp->diffuse);
    material.specular = *reinterpret_cast<glm::vec3 *>(mp->specular);
    material.shininess = mp->shininess;
    material.diffuseTexName = (mp->diffuse_texname != "") ? mp->diffuse_texname : defaultDiffuseName;
    material.normalTexName = (mp->normal_texname != "") ? mp->normal_texname : defaultNormalName;
    material.specularTexName = (mp->normal_texname != "") ? mp->specular_texname : defaultDiffuseName;
    loadImage(mp->diffuse_texname);
    loadImage(mp->normal_texname);
    loadImage(mp->specular_texname);
    m_materials.push_back(material);
  }

  m_ibos.resize(m_materials.size());
  // Loop over shapes
  for (size_t s = 0; s < shapes.size(); s++) {
    // Loop over faces(polygon)
    for (size_t f = 0; f < shapes[s].mesh.num_face_vertices.size(); f++) {
      int current_material_id = shapes[s].mesh.material_ids[f];
      if ((current_material_id < 0) || (current_material_id >= static_cast<int>(materials.size()))) {
        // Invalid material ID. Use default material.
        current_material_id = materials.size() - 1; // Default material is added to the last item in `materials`.
      }

      // Loop over vertices in the face.
      for (size_t v = 0; v < 3; v++) {
        // access to vertex
        tinyobj::index_t idx = shapes[s].mesh.indices[3 * f + v];
        tinyobj::real_t vx = attrib.vertices[3 * idx.vertex_index + 0];
        tinyobj::real_t vy = attrib.vertices[3 * idx.vertex_index + 1];
        tinyobj::real_t vz = attrib.vertices[3 * idx.vertex_index + 2];
        m_vertexPositions.push_back(glm::vec3(vx, vy, vz));

        if (attrib.normals.size() > 0) {
          tinyobj::real_t nx = attrib.normals[3 * idx.normal_index + 0];
          tinyobj::real_t ny = attrib.normals[3 * idx.normal_index + 1];
          tinyobj::real_t nz = attrib.normals[3 * idx.normal_index + 2];
          m_vertexNormals.push_back(-glm::vec3(nx, ny, nz));
        }
        if (attrib.texcoords.size() > 0) {
          tinyobj::real_t tx = attrib.texcoords[2 * idx.texcoord_index + 0];
          tinyobj::real_t ty = attrib.texcoords[2 * idx.texcoord_index + 1];
          m_vertexUVs.push_back(glm::vec2(tx, ty));
        } else {
          m_vertexUVs.push_back({0, 0});
        }
        //! note: beware attrib.colors is not empty even if no colors were specified (it is filled with black colors)
        tinyobj::real_t cR = attrib.colors[3 * idx.vertex_index + 0];
        tinyobj::real_t cG = attrib.colors[3 * idx.vertex_index + 1];
        tinyobj::real_t cB = attrib.colors[3 * idx.vertex_index + 2];
        tinyobj::real_t cA = 1;
        m_vertexColors.push_back(glm::vec4(cR, cG, cB, cA));
        m_ibos[current_material_id].push_back(m_vertexPositions.size() - 1);
      }

      // Compute the geometric normal if not specified.
      if (attrib.normals.size() == 0) {
        size_t nbVertices = m_vertexPositions.size();
        const glm::vec3 & v0 = m_vertexPositions[nbVertices - 3];
        const glm::vec3 & v1 = m_vertexPositions[nbVertices - 2];
        const glm::vec3 & v2 = m_vertexPositions[nbVertices - 1];
        glm::vec3 normal = calcNormal(v0, v1, v2);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
        m_vertexNormals.push_back(normal);
      }
    }
  }
  computeTangents();
  cleanUpDuplicates();
}